

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O3

_Bool ray_intersect_segments
                (vec3 ro,vec3 rd,vec3 *p0,vec3 *p1,float *radius,int num_segments,float *t,int *idx)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  long lVar4;
  float fVar5;
  float in_XMM0_Dc;
  float in_XMM0_Dd;
  float in_XMM2_Dc;
  float in_XMM2_Dd;
  vec3 p1_00;
  vec3 q1;
  vec3 p2;
  vec3 q2;
  float s0;
  float t0;
  vec3 c1;
  vec3 c0;
  float local_98;
  float local_8c;
  undefined8 local_88;
  float fStack_80;
  float fStack_7c;
  float *local_70;
  int *local_68;
  float local_5c;
  undefined1 local_58 [16];
  vec3 local_48;
  vec3 local_3c;
  
  p1_00.z = ro.z;
  auVar1._8_4_ = in_XMM0_Dc;
  auVar1._0_8_ = ro._0_8_;
  auVar1._12_4_ = in_XMM0_Dd;
  local_98 = 3.4028235e+38;
  local_70 = t;
  if (0 < num_segments) {
    local_88._0_4_ = rd.x;
    local_88._4_4_ = rd.y;
    local_58._0_4_ = ro.x;
    local_58._4_4_ = ro.y;
    local_88._4_4_ = local_88._4_4_ + (float)local_58._4_4_;
    local_88._0_4_ = (float)local_88 + (float)local_58._0_4_;
    fStack_80 = in_XMM2_Dc + in_XMM0_Dc;
    fStack_7c = in_XMM2_Dd + in_XMM0_Dd;
    local_98 = 3.4028235e+38;
    lVar4 = 2;
    uVar3 = 0;
    local_68 = idx;
    local_58 = auVar1;
    do {
      auVar2 = local_58;
      auVar1 = _local_88;
      p1_00.x = (float)local_58._0_4_;
      p1_00.y = (float)local_58._4_4_;
      q1.z = rd.z + p1_00.z;
      q1.x = (float)local_88;
      q1.y = local_88._4_4_;
      p2.z = (&p0->x)[lVar4];
      p2._0_8_ = *(undefined8 *)((long)p0 + lVar4 * 4 + -8);
      q2.z = (&p1->x)[lVar4];
      q2._0_8_ = *(undefined8 *)((long)p1 + lVar4 * 4 + -8);
      _local_88 = auVar1;
      local_58 = auVar2;
      fVar5 = closest_point_ray_segment(p1_00,q1,p2,q2,&local_8c,&local_5c,&local_3c,&local_48);
      if ((fVar5 < radius[uVar3] * radius[uVar3]) && (local_8c < local_98)) {
        *local_68 = (int)uVar3;
        local_98 = local_8c;
      }
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 3;
    } while ((uint)num_segments != uVar3);
  }
  *local_70 = local_98;
  return local_98 < 3.4028235e+38;
}

Assistant:

bool ray_intersect_segments(vec3 ro, vec3 rd, vec3 *p0, vec3 *p1, float *radius, int num_segments, float *t, int *idx) {
    float min_t = FLT_MAX;

    for (int i = 0; i < num_segments; i++) {
        float s0, t0;
        vec3 c0, c1;
        float dist = closest_point_ray_segment(ro, vec3_add(ro, rd), p0[i], p1[i], &s0, &t0, &c0, &c1);
        if (dist < radius[i] * radius[i]) {
            if (s0 < min_t) {
                min_t = s0;
                *idx = i;
            }
        }
    }

    *t = min_t;
    return min_t < FLT_MAX;
}